

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_key.h
# Opt level: O3

string * __thiscall
cppcms::string_key::str_abi_cxx11_(string *__return_storage_ptr__,string_key *this)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  
  pcVar1 = this->begin_;
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->key_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (this->key_)._M_string_length);
  }
  else {
    pcVar2 = this->end_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
		{
			if(begin_)
				return std::string(begin_,end_-begin_);
			else
				return key_;
		}